

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall vmips::Unconditional::output(Unconditional *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  __shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar1 = (*(this->super_Instruction)._vptr_Instruction[1])();
  poVar2 = std::operator<<(out,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ");
  std::__shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&this->block);
  std::operator<<(poVar2,(string *)&(local_28._M_ptr)->label);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void Unconditional::output(std::ostream &out) const {
    out << name() << " " << block.lock()->label;
}